

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_cmp_abs(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = X->n;
  if (uVar2 != 0) {
    do {
      if (X->p[uVar2 - 1] != 0) goto LAB_0010ac19;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  uVar2 = 0;
LAB_0010ac19:
  uVar3 = Y->n;
  iVar1 = 0;
  if (uVar3 != 0) {
    do {
      if (Y->p[uVar3 - 1] != 0) goto LAB_0010ac37;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = 0;
LAB_0010ac37:
  if (uVar3 != 0 || uVar2 != 0) {
    if (uVar2 <= uVar3) {
      if (uVar3 <= uVar2) {
        do {
          bVar4 = uVar2 == 0;
          uVar2 = uVar2 - 1;
          if (bVar4) {
            return 0;
          }
          if (Y->p[uVar2] < X->p[uVar2]) goto LAB_0010ac44;
        } while (Y->p[uVar2] <= X->p[uVar2]);
      }
      return -1;
    }
LAB_0010ac44:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_cmp_abs( const mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    size_t i, j;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );

    for( i = X->n; i > 0; i-- )
        if( X->p[i - 1] != 0 )
            break;

    for( j = Y->n; j > 0; j-- )
        if( Y->p[j - 1] != 0 )
            break;

    if( i == 0 && j == 0 )
        return( 0 );

    if( i > j ) return(  1 );
    if( j > i ) return( -1 );

    for( ; i > 0; i-- )
    {
        if( X->p[i - 1] > Y->p[i - 1] ) return(  1 );
        if( X->p[i - 1] < Y->p[i - 1] ) return( -1 );
    }

    return( 0 );
}